

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_add2_mem(void *vz,void *vx,void *vy,int bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong *puVar12;
  uint in_ECX;
  ulong *puVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int offset;
  uint32_t *y4;
  uint32_t *x4;
  uint32_t *z4;
  int four;
  uint64_t *y8;
  uint64_t *x8;
  uint64_t *z8;
  int eight;
  uint8_t *y1;
  uint8_t *x1;
  uint8_t *z1;
  uint i;
  uint count;
  __m256i *y32;
  __m256i *x32;
  __m256i *z32;
  __m128i *y16;
  __m128i *x16;
  __m128i *z16;
  uint local_1d0;
  ulong *local_1b0;
  ulong *local_1a8;
  ulong *local_1a0;
  uint local_194;
  
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  local_1a0 = in_RDI;
  local_194 = in_ECX;
  if (CpuHasAVX2) {
    uVar10 = (int)in_ECX / 0x20;
    for (local_1d0 = 0; local_1d0 < uVar10; local_1d0 = local_1d0 + 1) {
      puVar12 = in_RDI + (ulong)local_1d0 * 4;
      puVar13 = in_RDI + (ulong)local_1d0 * 4;
      uVar1 = puVar13[1];
      uVar2 = puVar13[2];
      uVar3 = puVar13[3];
      puVar14 = in_RSI + (ulong)local_1d0 * 4;
      uVar4 = puVar14[1];
      uVar5 = puVar14[2];
      uVar6 = puVar14[3];
      puVar15 = in_RDX + (ulong)local_1d0 * 4;
      uVar7 = puVar15[1];
      uVar8 = puVar15[2];
      uVar9 = puVar15[3];
      *puVar12 = *puVar13 ^ *puVar14 ^ *puVar15;
      puVar12[1] = uVar1 ^ uVar4 ^ uVar7;
      puVar12[2] = uVar2 ^ uVar5 ^ uVar8;
      puVar12[3] = uVar3 ^ uVar6 ^ uVar9;
    }
    local_194 = (int)in_ECX % 0x20;
    local_1a0 = in_RDI + (ulong)uVar10 * 4;
    local_1a8 = in_RSI + (ulong)uVar10 * 4;
    local_1b0 = in_RDX + (ulong)uVar10 * 4;
  }
  for (; 0xf < (int)local_194; local_194 = local_194 - 0x10) {
    uVar1 = local_1a8[1];
    uVar2 = local_1b0[1];
    *local_1a0 = *local_1a0 ^ *local_1a8 ^ *local_1b0;
    local_1a0[1] = local_1a0[1] ^ uVar1 ^ uVar2;
    local_1a8 = local_1a8 + 2;
    local_1b0 = local_1b0 + 2;
    local_1a0 = local_1a0 + 2;
  }
  uVar10 = local_194 & 8;
  if (uVar10 != 0) {
    *local_1a0 = *local_1a8 ^ *local_1b0 ^ *local_1a0;
  }
  if ((local_194 & 4) != 0) {
    *(uint *)((long)local_1a0 + (long)(int)uVar10) =
         *(uint *)((long)local_1a8 + (long)(int)uVar10) ^
         *(uint *)((long)local_1b0 + (long)(int)uVar10) ^
         *(uint *)((long)local_1a0 + (long)(int)uVar10);
  }
  iVar11 = uVar10 + (local_194 & 4);
  local_194 = local_194 & 3;
  if (local_194 != 1) {
    if (local_194 != 2) {
      if (local_194 != 3) {
        return;
      }
      *(byte *)((long)local_1a0 + (long)(iVar11 + 2)) =
           *(byte *)((long)local_1a0 + (long)(iVar11 + 2)) ^
           *(byte *)((long)local_1a8 + (long)(iVar11 + 2)) ^
           *(byte *)((long)local_1b0 + (long)(iVar11 + 2));
    }
    *(byte *)((long)local_1a0 + (long)(iVar11 + 1)) =
         *(byte *)((long)local_1a0 + (long)(iVar11 + 1)) ^
         *(byte *)((long)local_1a8 + (long)(iVar11 + 1)) ^
         *(byte *)((long)local_1b0 + (long)(iVar11 + 1));
  }
  *(byte *)((long)local_1a0 + (long)iVar11) =
       *(byte *)((long)local_1a0 + (long)iVar11) ^
       *(byte *)((long)local_1a8 + (long)iVar11) ^ *(byte *)((long)local_1b0 + (long)iVar11);
  return;
}

Assistant:

void gf256_add2_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx,
                               const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128*>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128*>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128*>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // z[i] = z[i] xor x[i] xor y[i]
            vst1q_u8((uint8_t*)z16,
                veorq_u8(
                    vld1q_u8((uint8_t*)z16),
                    veorq_u8(
                        vld1q_u8((uint8_t*)x16),
                        vld1q_u8((uint8_t*)y16))));

            bytes -= 16, ++x16, ++y16, ++z16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z16);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            z8[ii] ^= x8[ii] ^ y8[ii];

        z16 = reinterpret_cast<GF256_M128 *>(z8 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        const unsigned count = bytes / 32;
        for (unsigned i = 0; i < count; ++i)
        {
            _mm256_storeu_si256(z32 + i,
                _mm256_xor_si256(
                    _mm256_loadu_si256(z32 + i),
                    _mm256_xor_si256(
                        _mm256_loadu_si256(x32 + i),
                        _mm256_loadu_si256(y32 + i))));
        }

        bytes -= count * 32;
        z16 = reinterpret_cast<GF256_M128 *>(z32 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x32 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y32 + count);
    }
# endif // GF256_TRY_AVX2

    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // z[i] = z[i] xor x[i] xor y[i]
        _mm_storeu_si128(z16,
            _mm_xor_si128(
                _mm_loadu_si128(z16),
                _mm_xor_si128(
                    _mm_loadu_si128(x16),
                    _mm_loadu_si128(y16))));

        bytes -= 16, ++x16, ++y16, ++z16;
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t *>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *z8 ^= *x8 ^ *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1 + eight);
        const uint32_t * GF256_RESTRICT x4 = reinterpret_cast<const uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *z4 ^= *x4 ^ *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] ^= x1[offset + 2] ^ y1[offset + 2];
    case 2: z1[offset + 1] ^= x1[offset + 1] ^ y1[offset + 1];
    case 1: z1[offset] ^= x1[offset] ^ y1[offset];
    default:
        break;
    }
}